

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psobjs.c
# Opt level: O2

void ps_parser_to_token_array
               (PS_Parser parser,T1_Token tokens,FT_UInt max_tokens,FT_Int *pnum_tokens)

{
  T1_Token pTVar1;
  FT_Byte *pFVar2;
  FT_Byte *pFVar3;
  FT_Byte *pFVar4;
  FT_Byte *pFVar5;
  long lVar6;
  T1_TokenRec token;
  T1_TokenRec master;
  
  *pnum_tokens = -1;
  ps_parser_to_token(parser,&master);
  if (master.type == T1_TOKEN_TYPE_ARRAY) {
    pFVar2 = parser->cursor;
    pFVar3 = parser->limit;
    pFVar4 = master.start + 1;
    parser->cursor = pFVar4;
    pFVar5 = master.limit + -1;
    parser->limit = pFVar5;
    lVar6 = 0;
    while (pFVar4 < pFVar5) {
      ps_parser_to_token(parser,&token);
      if (token.type == T1_TOKEN_TYPE_NONE) break;
      pTVar1 = (T1_Token)((long)&tokens->start + lVar6);
      if (pTVar1 < tokens + max_tokens && tokens != (T1_Token)0x0) {
        *(ulong *)&pTVar1->type = CONCAT44(token._20_4_,token.type);
        pTVar1->start = token.start;
        pTVar1->limit = token.limit;
      }
      pFVar5 = parser->limit;
      lVar6 = lVar6 + 0x18;
      pFVar4 = parser->cursor;
    }
    *pnum_tokens = (FT_Int)(lVar6 / 0x18);
    parser->cursor = pFVar2;
    parser->limit = pFVar3;
  }
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  ps_parser_to_token_array( PS_Parser  parser,
                            T1_Token   tokens,
                            FT_UInt    max_tokens,
                            FT_Int*    pnum_tokens )
  {
    T1_TokenRec  master;


    *pnum_tokens = -1;

    /* this also handles leading whitespace */
    ps_parser_to_token( parser, &master );

    if ( master.type == T1_TOKEN_TYPE_ARRAY )
    {
      FT_Byte*  old_cursor = parser->cursor;
      FT_Byte*  old_limit  = parser->limit;
      T1_Token  cur        = tokens;
      T1_Token  limit      = cur + max_tokens;


      /* don't include outermost delimiters */
      parser->cursor = master.start + 1;
      parser->limit  = master.limit - 1;

      while ( parser->cursor < parser->limit )
      {
        T1_TokenRec  token;


        ps_parser_to_token( parser, &token );
        if ( !token.type )
          break;

        if ( tokens && cur < limit )
          *cur = token;

        cur++;
      }

      *pnum_tokens = (FT_Int)( cur - tokens );

      parser->cursor = old_cursor;
      parser->limit  = old_limit;
    }
  }